

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O2

void __thiscall psy::C::NameCatalog::markIndexedNodeAsEncloser(NameCatalog *this,SyntaxNode *node)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *this_00;
  SyntaxNode *node_local;
  
  node_local = node;
  if (node == (SyntaxNode *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                            );
    this_00 = (ostream *)std::operator<<(poVar3,":");
    iVar1 = 0x3f;
  }
  else {
    bVar2 = isIndexed(this,node);
    if (bVar2) {
      std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>::push_back
                ((deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_> *)
                 this,&node_local);
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                            );
    this_00 = (ostream *)std::operator<<(poVar3,":");
    iVar1 = 0x40;
  }
  poVar3 = (ostream *)std::ostream::operator<<(this_00,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"<empty message>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void NameCatalog::markIndexedNodeAsEncloser(const SyntaxNode* node)
{
    PSY_ASSERT_2(node, return);
    PSY_ASSERT_2(isIndexed(node), return);

    enclosureStack_.push(node);
}